

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O0

void __thiscall
Test::HTMLOutput::generateTestsTable
          (HTMLOutput *this,ostream *stream,SuiteInfo *suite,bool includePassed)

{
  ulong totalTests;
  bool bVar1;
  ostream *poVar2;
  pointer pTVar3;
  size_type sVar4;
  size_type sVar5;
  pointer pAVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  string *local_1b0;
  string local_e0;
  __normal_iterator<const_Test::Assertion_*,_std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>_>
  local_c0;
  __normal_iterator<const_Test::Assertion_*,_std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>_>
  local_b8;
  const_iterator assertion;
  string local_90;
  string local_60;
  ulong local_40;
  size_t totalAssertions;
  __normal_iterator<const_Test::CollectorOutput::TestMethodInfo_*,_std::vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>_>
  local_30;
  const_iterator testMethod;
  bool includePassed_local;
  SuiteInfo *suite_local;
  ostream *stream_local;
  HTMLOutput *this_local;
  
  testMethod._M_current._7_1_ = includePassed;
  poVar2 = std::operator<<(stream,"<table id=\'suite_");
  poVar2 = std::operator<<(poVar2,(string *)suite);
  poVar2 = std::operator<<(poVar2,"\'>");
  poVar2 = std::operator<<(poVar2,
                           "<tr><th>Test-method</th><th># Assertions</th><th>Passed Assertions</th><th>Failures</th></tr>"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_30._M_current =
       (TestMethodInfo *)
       std::
       vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>
       ::begin(&suite->methods);
  while( true ) {
    totalAssertions =
         (size_t)std::
                 vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>
                 ::end(&suite->methods);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_Test::CollectorOutput::TestMethodInfo_*,_std::vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>_>
                        *)&totalAssertions);
    if (!bVar1) break;
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Test::CollectorOutput::TestMethodInfo_*,_std::vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>_>
             ::operator->(&local_30);
    sVar4 = std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>::size
                      (&pTVar3->passedAssertions);
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Test::CollectorOutput::TestMethodInfo_*,_std::vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>_>
             ::operator->(&local_30);
    sVar5 = std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>::size
                      (&pTVar3->failedAssertions);
    local_40 = sVar4 + sVar5;
    poVar2 = std::operator<<(stream,"<tr><td>");
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Test::CollectorOutput::TestMethodInfo_*,_std::vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>_>
             ::operator->(&local_30);
    Output::stripMethodName(&local_60,(Output *)this,&pTVar3->methodName);
    poVar2 = std::operator<<(poVar2,(string *)&local_60);
    poVar2 = std::operator<<(poVar2,"(");
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Test::CollectorOutput::TestMethodInfo_*,_std::vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>_>
             ::operator->(&local_30);
    Output::truncateString(&local_90,(Output *)this,&pTVar3->argString,0x14);
    poVar2 = std::operator<<(poVar2,(string *)&local_90);
    poVar2 = std::operator<<(poVar2,")</td>");
    poVar2 = std::operator<<(poVar2,"<td>");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_40);
    poVar2 = std::operator<<(poVar2,"</td>");
    poVar2 = std::operator<<(poVar2,"<td class=\'");
    totalTests = local_40;
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Test::CollectorOutput::TestMethodInfo_*,_std::vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>_>
             ::operator->(&local_30);
    sVar4 = std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>::size
                      (&pTVar3->passedAssertions);
    getCssClass_abi_cxx11_((string *)&assertion,totalTests,sVar4);
    poVar2 = std::operator<<(poVar2,(string *)&assertion);
    poVar2 = std::operator<<(poVar2,"\'>");
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Test::CollectorOutput::TestMethodInfo_*,_std::vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>_>
             ::operator->(&local_30);
    sVar4 = std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>::size
                      (&pTVar3->passedAssertions);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar4);
    poVar2 = std::operator<<(poVar2," (");
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Test::CollectorOutput::TestMethodInfo_*,_std::vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>_>
             ::operator->(&local_30);
    sVar4 = std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>::size
                      (&pTVar3->passedAssertions);
    auVar8._8_4_ = (int)(sVar4 >> 0x20);
    auVar8._0_8_ = sVar4;
    auVar8._12_4_ = 0x45300000;
    auVar9._8_4_ = (int)(local_40 >> 0x20);
    auVar9._0_8_ = local_40;
    auVar9._12_4_ = 0x45300000;
    dVar7 = Output::prettifyPercentage
                      ((Output *)this,
                       (auVar8._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0),
                       (auVar9._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)local_40) - 4503599627370496.0));
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar7);
    poVar2 = std::operator<<(poVar2,"%)</td>");
    std::operator<<(poVar2,"<td>");
    std::__cxx11::string::~string((string *)&assertion);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_60);
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Test::CollectorOutput::TestMethodInfo_*,_std::vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>_>
             ::operator->(&local_30);
    local_b8._M_current =
         (Assertion *)
         std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>::begin
                   (&pTVar3->failedAssertions);
    while( true ) {
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_Test::CollectorOutput::TestMethodInfo_*,_std::vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>_>
               ::operator->(&local_30);
      local_c0._M_current =
           (Assertion *)
           std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>::end
                     (&pTVar3->failedAssertions);
      bVar1 = __gnu_cxx::operator!=(&local_b8,&local_c0);
      if (!bVar1) break;
      poVar2 = std::operator<<(stream,"<span class=\'message\'><a href=\'file://");
      pAVar6 = __gnu_cxx::
               __normal_iterator<const_Test::Assertion_*,_std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>_>
               ::operator->(&local_b8);
      poVar2 = std::operator<<(poVar2,(string *)&pAVar6->file);
      poVar2 = std::operator<<(poVar2,"\'>");
      pAVar6 = __gnu_cxx::
               __normal_iterator<const_Test::Assertion_*,_std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>_>
               ::operator->(&local_b8);
      poVar2 = std::operator<<(poVar2,(string *)&pAVar6->file);
      poVar2 = std::operator<<(poVar2,"</a>: ");
      pAVar6 = __gnu_cxx::
               __normal_iterator<const_Test::Assertion_*,_std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>_>
               ::operator->(&local_b8);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pAVar6->lineNumber);
      poVar2 = std::operator<<(poVar2,": ");
      pAVar6 = __gnu_cxx::
               __normal_iterator<const_Test::Assertion_*,_std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>_>
               ::operator->(&local_b8);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (&pAVar6->errorMessage);
      if (bVar1) {
        pAVar6 = __gnu_cxx::
                 __normal_iterator<const_Test::Assertion_*,_std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>_>
                 ::operator->(&local_b8);
        local_1b0 = &pAVar6->userMessage;
      }
      else {
        pAVar6 = __gnu_cxx::
                 __normal_iterator<const_Test::Assertion_*,_std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>_>
                 ::operator->(&local_b8);
        local_1b0 = &pAVar6->errorMessage;
      }
      Output::truncateString(&local_e0,(Output *)this,local_1b0,0x3e);
      poVar2 = std::operator<<(poVar2,(string *)&local_e0);
      std::operator<<(poVar2,"</span>");
      std::__cxx11::string::~string((string *)&local_e0);
      __gnu_cxx::
      __normal_iterator<const_Test::Assertion_*,_std::vector<Test::Assertion,_std::allocator<Test::Assertion>_>_>
      ::operator++(&local_b8);
    }
    poVar2 = std::operator<<(stream,"</td>");
    poVar2 = std::operator<<(poVar2,"</tr>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_Test::CollectorOutput::TestMethodInfo_*,_std::vector<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>_>
    ::operator++(&local_30);
  }
  poVar2 = std::operator<<(stream,"</table>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(stream,"<a href=\'#top\'>Back to top</a>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void HTMLOutput::generateTestsTable(std::ostream &stream, const SuiteInfo &suite, bool includePassed) {
  stream << "<table id='suite_" << suite.suiteName << "'>"
         << "<tr><th>Test-method</th><th># Assertions</th><th>Passed Assertions</th><th>Failures</th></tr>"
         << std::endl;
  // content
  auto testMethod = suite.methods.begin();
  while (testMethod != suite.methods.end()) {
    std::size_t totalAssertions = testMethod->passedAssertions.size() + testMethod->failedAssertions.size();
    stream << "<tr><td>" << stripMethodName(testMethod->methodName) << "(" << truncateString(testMethod->argString, 20)
           << ")</td>"
           << "<td>" << totalAssertions << "</td>"
           << "<td class='" << getCssClass(totalAssertions, testMethod->passedAssertions.size()) << "'>"
           << testMethod->passedAssertions.size() << " ("
           << prettifyPercentage(
                  static_cast<double>(testMethod->passedAssertions.size()), static_cast<double>(totalAssertions))
           << "%)</td>"
           << "<td>";
    auto assertion = testMethod->failedAssertions.begin();
    while (assertion != testMethod->failedAssertions.end()) {
      stream << "<span class='message'><a href='file://" << assertion->file << "'>" << assertion->file
             << "</a>: " << assertion->lineNumber << ": "
             << truncateString(
                    (!assertion->errorMessage.empty() ? assertion->errorMessage : assertion->userMessage), 62)
             << "</span>";
      ++assertion;
    }
    stream << "</td>"
           << "</tr>" << std::endl;
    ++testMethod;
  }
  stream << "</table>" << std::endl;
  stream << "<a href='#top'>Back to top</a>" << std::endl;
}